

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O1

void handle_request(void *args)

{
  char cVar1;
  uint sockfd;
  size_t sVar2;
  int iVar3;
  int iVar4;
  http_header_t *phVar5;
  size_t sVar6;
  WebCallback_HostValidate p_Var7;
  char *pcVar8;
  MiniServerCallback p_Var9;
  MiniServerCallback p_Var10;
  size_t sVar11;
  void *pvVar12;
  char *pcVar13;
  int timeout;
  socklen_t addr_len;
  memptr header;
  SOCKINFO info;
  char host_port [256];
  membuffer redir_buf;
  char redir_str [256];
  http_parser_t parser;
  int local_55c [3];
  MiniServerCallback local_550;
  socklen_t local_544;
  memptr local_540;
  SOCKINFO local_530;
  char local_4a8 [256];
  membuffer local_3a8 [4];
  char local_328 [264];
  http_parser_t local_220;
  
  local_55c[1] = 0x1e;
  sockfd = *args;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x195,
             "miniserver %d: READING\n",(ulong)sockfd);
  iVar3 = sock_init_with_ip(&local_530,sockfd,(sockaddr *)((long)args + 8));
  if (iVar3 != 0) {
    free(args);
    httpmsg_destroy(&local_220.msg);
    return;
  }
  iVar3 = http_RecvMessage(&local_530,&local_220,HTTPMETHOD_UNKNOWN,local_55c + 1,local_55c);
  if (iVar3 != 0) goto LAB_0010b86a;
  p_Var9 = (MiniServerCallback)0x0;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1aa,
             "miniserver %d: PROCESSING...\n",(ulong)sockfd);
  p_Var10 = gGetCallback;
  pvVar12 = gWebCallback_HostValidateCookie;
  p_Var7 = gWebCallback_HostValidate;
  if (local_220.msg.method < (HTTPMETHOD_SIMPLEGET|HTTPMETHOD_DELETE)) {
    if ((0x101cU >> (local_220.msg.method & 0x1f) & 1) == 0) {
      if ((0x1c0U >> (local_220.msg.method & 0x1f) & 1) == 0) {
        p_Var7 = (WebCallback_HostValidate)0x0;
        pvVar12 = (void *)0x0;
        p_Var10 = p_Var9;
        if ((0x820U >> (local_220.msg.method & 0x1f) & 1) == 0) goto LAB_0010b74a;
        pcVar8 = "miniserver %d: got SOAP msg\n";
        iVar3 = 0xfe;
        p_Var9 = gSoapCallback;
      }
      else {
        pcVar8 = "miniserver %d: got GENA msg\n";
        iVar3 = 0x10a;
        p_Var9 = gGenaCallback;
      }
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",iVar3,pcVar8,
                 (ulong)(uint)local_530.socket);
      goto LAB_0010b747;
    }
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x119,
               "miniserver %d: got WEB server msg\n",(ulong)(uint)local_530.socket);
  }
  else {
LAB_0010b747:
    p_Var7 = (WebCallback_HostValidate)0x0;
    pvVar12 = (void *)0x0;
    p_Var10 = p_Var9;
  }
LAB_0010b74a:
  if (p_Var10 == (MiniServerCallback)0x0) {
    local_55c[0] = 500;
    goto LAB_0010b86a;
  }
  phVar5 = httpmsg_find_hdr(&local_220.msg,7,&local_540);
  local_55c[0] = -0x77;
  if (phVar5 == (http_header_t *)0x0) goto LAB_0010b86a;
  sVar6 = 0xff;
  if (local_540.length < 0xff) {
    sVar6 = local_540.length;
  }
  pcVar8 = local_4a8;
  local_550 = p_Var10;
  memcpy(pcVar8,local_540.buf,sVar6);
  local_4a8[sVar6] = '\0';
  if (p_Var7 == (WebCallback_HostValidate)0x0) {
    sVar2 = sVar6;
    do {
      sVar11 = sVar2;
      if (sVar11 == 1) goto LAB_0010b813;
      cVar1 = local_530.foreign_sockaddr.__ss_padding[sVar11 + 0x7d];
    } while ((cVar1 != ']') && (sVar2 = sVar11 - 1, cVar1 != ':'));
    pcVar8 = local_530.foreign_sockaddr.__ss_padding + sVar11 + 0x7d;
LAB_0010b813:
    pcVar13 = local_4a8 + sVar6;
    if (*pcVar8 == ':') {
      *pcVar8 = '\0';
      pcVar13 = pcVar8;
    }
    iVar3 = inet_pton(2,local_4a8,local_328);
    if (iVar3 != 1) {
      sVar6 = strlen(local_4a8);
      if (((2 < sVar6) && (local_4a8[0] == '[')) && (pcVar13[-1] == ']')) {
        pcVar13[-1] = '\0';
        iVar4 = inet_pton(10,local_4a8 + 1,local_328);
        iVar3 = 0;
        if (iVar4 == 1) goto LAB_0010b84e;
      }
      if (gAllowLiteralHostRedirection == 0) {
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x143,
                   "Possible DNS Rebind attack prevented.\n");
        local_55c[0] = -0x77;
        goto LAB_0010b86a;
      }
      local_55c[2] = 0x1e;
      local_544 = 0x80;
      iVar3 = getsockname(local_530.socket,(sockaddr *)local_3a8,&local_544);
      if (iVar3 == 0) {
        if ((short)local_3a8[0].buf == 10) {
          pcVar8 = inet_ntop(10,&local_3a8[0].length,local_328,0x100);
          if (pcVar8 != (char *)0x0) {
            pcVar8 = "[%s]:%d";
LAB_0010ba05:
            snprintf(local_4a8,0x100,pcVar8,local_328,
                     (ulong)(ushort)(local_3a8[0].buf._2_2_ << 8 | local_3a8[0].buf._2_2_ >> 8));
          }
        }
        else {
          pcVar8 = inet_ntop(2,(void *)((long)&local_3a8[0].buf + 4),local_328,0x100);
          if (pcVar8 != (char *)0x0) {
            pcVar8 = "%s:%d";
            goto LAB_0010ba05;
          }
        }
      }
      membuffer_init(local_3a8);
      snprintf(local_328,0x100,"HTTP/1.1 307 Temporary Redirect\r\nLocation: http://%s\r\n\r\n",
               local_4a8);
      membuffer_append_str(local_3a8,local_328);
      iVar3 = http_SendMessage(&local_530,local_55c + 2,"b",
                               CONCAT44(local_3a8[0].buf._4_4_,
                                        CONCAT22(local_3a8[0].buf._2_2_,(short)local_3a8[0].buf)),
                               local_3a8[0].length);
      membuffer_destroy(local_3a8);
      local_55c[0] = iVar3;
      goto LAB_0010b86a;
    }
    iVar3 = 0;
  }
  else {
    iVar3 = (*p_Var7)(local_4a8,pvVar12);
    local_55c[0] = -0x77;
    if (iVar3 == -0x77) goto LAB_0010b86a;
  }
LAB_0010b84e:
  (*local_550)(&local_220,&local_220.msg,&local_530);
  local_55c[0] = iVar3;
LAB_0010b86a:
  if (0 < local_55c[0]) {
    http_SendStatusResponse
              (&local_530,local_55c[0],local_220.msg.major_version,local_220.msg.minor_version);
  }
  sock_destroy(&local_530,2);
  httpmsg_destroy(&local_220.msg);
  free(args);
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1c3,
             "miniserver %d: COMPLETE\n",(ulong)sockfd);
  return;
}

Assistant:

static void handle_request(
	/*! [in] Request Message to be handled. */
	void *args)
{
	SOCKINFO info;
	int http_error_code;
	int ret_code;
	int major = 1;
	int minor = 1;
	http_parser_t parser;
	http_message_t *hmsg = NULL;
	int timeout = HTTP_DEFAULT_TIMEOUT;
	struct mserv_request_t *request = (struct mserv_request_t *)args;
	SOCKET connfd = request->connfd;

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: READING\n",
		connfd);
	/* parser_request_init( &parser ); */ /* LEAK_FIX_MK */
	hmsg = &parser.msg;
	ret_code = sock_init_with_ip(
		&info, connfd, (struct sockaddr *)&request->foreign_sockaddr);
	if (ret_code != UPNP_E_SUCCESS) {
		free(request);
		httpmsg_destroy(hmsg);
		return;
	}
	/* read */
	ret_code = http_RecvMessage(
		&info, &parser, HTTPMETHOD_UNKNOWN, &timeout, &http_error_code);
	if (ret_code != 0) {
		goto error_handler;
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: PROCESSING...\n",
		connfd);
	/* dispatch */
	http_error_code = dispatch_request(&info, &parser);
	if (http_error_code != 0) {
		goto error_handler;
	}
	http_error_code = 0;

error_handler:
	if (http_error_code > 0) {
		if (hmsg) {
			major = hmsg->major_version;
			minor = hmsg->minor_version;
		}
		handle_error(&info, http_error_code, major, minor);
	}
	sock_destroy(&info, SD_BOTH);
	httpmsg_destroy(hmsg);
	free(request);

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: COMPLETE\n",
		connfd);
}